

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O1

int inflate_block(BGZF *fp,int block_length)

{
  int iVar1;
  int iVar2;
  long local_88;
  int local_80;
  void *local_70;
  undefined4 local_68;
  int local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0;
  uStack_40 = 0;
  local_88 = (long)fp->compressed_block + 0x12;
  local_80 = block_length + -0x10;
  local_70 = fp->uncompressed_block;
  local_68 = 0x10000;
  iVar1 = inflateInit2_(&local_88,0xfffffff1,"1.2.11",0x70);
  if (iVar1 == 0) {
    iVar1 = inflate(&local_88,4);
    iVar2 = inflateEnd(&local_88);
    if ((iVar1 == 1) && (iVar2 == 0)) {
      return local_60;
    }
  }
  *(byte *)fp = *(byte *)fp | 1;
  return -1;
}

Assistant:

static int inflate_block(BGZF* fp, int block_length)
{
    z_stream zs;
    zs.zalloc = NULL;
    zs.zfree = NULL;
    zs.next_in = (Bytef*)fp->compressed_block + 18;
    zs.avail_in = block_length - 16;
    zs.next_out = (Bytef*)fp->uncompressed_block;
    zs.avail_out = BGZF_MAX_BLOCK_SIZE;

    if (inflateInit2(&zs, -15) != Z_OK) {
        fp->errcode |= BGZF_ERR_ZLIB;
        return -1;
    }
    if (inflate(&zs, Z_FINISH) != Z_STREAM_END) {
        inflateEnd(&zs);
        fp->errcode |= BGZF_ERR_ZLIB;
        return -1;
    }
    if (inflateEnd(&zs) != Z_OK) {
        fp->errcode |= BGZF_ERR_ZLIB;
        return -1;
    }
    return zs.total_out;
}